

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * attachWithToSelect(Parse *pParse,Select *pSelect,With *pWith)

{
  With *in_RDX;
  Select *in_RSI;
  
  if (in_RSI == (Select *)0x0) {
    sqlite3WithDelete((sqlite3 *)0x0,in_RDX);
  }
  else {
    in_RSI->pWith = in_RDX;
    parserDoubleLinkSelect(pParse,pSelect);
  }
  return in_RSI;
}

Assistant:

static Select *attachWithToSelect(Parse *pParse, Select *pSelect, With *pWith){
    if( pSelect ){
      pSelect->pWith = pWith;
      parserDoubleLinkSelect(pParse, pSelect);
    }else{
      sqlite3WithDelete(pParse->db, pWith);
    }
    return pSelect;
  }